

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::SimpleTypeHandler<1ul>::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
          (SimpleTypeHandler<1ul> *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  BYTE values;
  PropertyTypes values_00;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int iVar3;
  PropertyId PVar4;
  BOOL BVar5;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar6;
  undefined4 *puVar7;
  Var aValue;
  PropertyRecord *pPVar8;
  PropertyRecord **ppPVar9;
  DynamicType *pDVar10;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  bool markAsFixed;
  Var value;
  int i;
  bool allowFixedFields;
  bool hasSingletonInstance;
  TrackAllocData local_60;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *local_38;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *newTypeHandler
  ;
  DynamicType *oldType;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  oldType = (DynamicType *)ScriptContext::GetRecycler((ScriptContext *)recycler);
  newTypeHandler =
       (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
       DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  pDVar10 = oldType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
             ,0x87);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar10,&local_60);
  pSVar6 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
           new<Memory::Recycler>(0x30,alloc,0x43c4b0);
  pDVar10 = oldType;
  iVar3 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  inlineSlotCapacity = DynamicTypeHandler::GetInlineSlotCapacity((DynamicTypeHandler *)this);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots((DynamicTypeHandler *)this);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
  SimpleDictionaryTypeHandlerBase
            (pSVar6,(Recycler *)pDVar10,iVar3,inlineSlotCapacity,offsetOfInlineSlots,false,false);
  local_38 = pSVar6;
  bVar2 = SimpleTypeHandler<1UL>::HasSingletonInstanceOnlyIfNeeded((SimpleTypeHandler<1UL> *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x89,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = DynamicTypeHandler::SetSingletonInstanceIfNeeded
                    (&local_38->super_DynamicTypeHandler,(DynamicObject *)scriptContext);
  local_b9 = false;
  if (bVar2) {
    local_b9 = DynamicObject::HasLockedType((DynamicObject *)scriptContext);
  }
  value._0_4_ = 0;
  do {
    pSVar6 = local_38;
    if (*(int *)(this + 0x18) <= (int)value) {
      values = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetFlags(&pSVar6->super_DynamicTypeHandler,'\"',values);
      iVar3 = (*(local_38->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x4e])();
      if (iVar3 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0xa2,"(!newTypeHandler->IsPathTypeHandler())",
                                    "!newTypeHandler->IsPathTypeHandler()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&local_38->super_DynamicTypeHandler)
      ;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0xa3,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                    "newTypeHandler->GetIsInlineSlotCapacityLocked()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pSVar6 = local_38;
      values_00 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetPropertyTypes(&pSVar6->super_DynamicTypeHandler,0xb0,values_00);
      DynamicTypeHandler::SetInstanceTypeHandler
                (&local_38->super_DynamicTypeHandler,(DynamicObject *)scriptContext,true);
      if (local_b9 != false) {
        pDVar10 = DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
        if (pDVar10 == (DynamicType *)newTypeHandler) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                      ,0xa9,
                                      "(!allowFixedFields || instance->GetDynamicType() != oldType)"
                                      ,"!allowFixedFields || instance->GetDynamicType() != oldType")
          ;
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      return local_38;
    }
    aValue = DynamicObject::GetSlot((DynamicObject *)scriptContext,(int)value);
    if (aValue == (Var)0x0) {
      pPVar8 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                         ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                          (this + (long)(int)value * 0x10 + 0x20));
      PVar4 = PropertyRecord::GetPropertyId(pPVar8);
      BVar5 = IsInternalPropertyId(PVar4);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x95,
                                    "(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()))"
                                    ,
                                    "value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId())"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    local_ba = false;
    if (local_b9 != false) {
      pPVar8 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                         ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                          (this + (long)(int)value * 0x10 + 0x20));
      PVar4 = PropertyRecord::GetPropertyId(pPVar8);
      BVar5 = IsInternalPropertyId(PVar4);
      local_ba = false;
      if (BVar5 == 0) {
        bVar2 = VarIs<Js::JavascriptFunction>(aValue);
        if (bVar2) {
          local_bb = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          local_bb = false;
        }
        local_ba = local_bb;
      }
    }
    pSVar6 = local_38;
    ppPVar9 = Memory::PointerValue<Js::PropertyRecord_const>
                        ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                         (this + (long)(int)value * 0x10 + 0x20));
    SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
               pSVar6,*ppPVar9,(PropertyAttributes)this[(long)(int)value * 0x10 + 0x28],true,
               local_ba,false,(ScriptContext *)recycler);
    value._0_4_ = (int)value + 1;
  } while( true );
}

Assistant:

T* SimpleTypeHandler<size>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

#if ENABLE_FIXED_FIELDS && DBG
        DynamicType* oldType = instance->GetDynamicType();
#endif

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, SimpleTypeHandler<size>::GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        Assert(HasSingletonInstanceOnlyIfNeeded());

        bool const hasSingletonInstance = newTypeHandler->SetSingletonInstanceIfNeeded(instance);
        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = hasSingletonInstance && instance->HasLockedType();
#endif

        for (int i = 0; i < propertyCount; i++)
        {
            Var value = instance->GetSlot(i);
            Assert(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()));
#if ENABLE_FIXED_FIELDS
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(descriptors[i].Id->GetPropertyId()) &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
#else
            bool markAsFixed = false;
#endif
            newTypeHandler->Add(PointerValue(descriptors[i].Id), descriptors[i].Attributes, true, markAsFixed, false, scriptContext);
        }

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        // We don't expect to convert to a PathTypeHandler.  If we change this later we need to review if we want the new type handler to have locked
        // inline slot capacity, or if we want to allow shrinking of the SimpleTypeHandler's inline slot capacity.
        Assert(!newTypeHandler->IsPathTypeHandler());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS && DBG
        // If we marked fields as fixed we had better forced a type transition.
        Assert(!allowFixedFields || instance->GetDynamicType() != oldType);
#endif

        return newTypeHandler;
    }